

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void deqp::gls::specializeProgramSources
               (ProgramSources *dst,ProgramSources *src,ProgramSpecializationParams *specParams)

{
  ProgramSources *this;
  ProgramSeparable local_21;
  ProgramSpecializationParams *local_20;
  ProgramSpecializationParams *specParams_local;
  ProgramSources *src_local;
  ProgramSources *dst_local;
  
  local_20 = specParams;
  specParams_local = (ProgramSpecializationParams *)src;
  src_local = dst;
  specializeShaderSources
            (dst,src,specParams,SHADERTYPE_VERTEX,generateVertexSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_FRAGMENT,
             generateFragmentSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_GEOMETRY,
             generateGeometrySpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,SHADERTYPE_TESSELLATION_CONTROL,
             generateTessControlSpecialization_abi_cxx11_);
  specializeShaderSources
            (src_local,(ProgramSources *)specParams_local,local_20,
             SHADERTYPE_TESSELLATION_EVALUATION,generateTessEvalSpecialization_abi_cxx11_);
  this = src_local;
  glu::ProgramSeparable::ProgramSeparable
            (&local_21,(bool)(*(byte *)&specParams_local[5].caseSpec & 1));
  glu::ProgramSources::operator<<(this,&local_21);
  return;
}

Assistant:

static void specializeProgramSources (glu::ProgramSources&					dst,
									  const glu::ProgramSources&			src,
									  const ProgramSpecializationParams&	specParams)
{
	specializeShaderSources(dst, src, specParams, SHADERTYPE_VERTEX,					generateVertexSpecialization);
	specializeShaderSources(dst, src, specParams, SHADERTYPE_FRAGMENT,					generateFragmentSpecialization);
	specializeShaderSources(dst, src, specParams, SHADERTYPE_GEOMETRY,					generateGeometrySpecialization);
	specializeShaderSources(dst, src, specParams, SHADERTYPE_TESSELLATION_CONTROL,		generateTessControlSpecialization);
	specializeShaderSources(dst, src, specParams, SHADERTYPE_TESSELLATION_EVALUATION,	generateTessEvalSpecialization);

	dst << ProgramSeparable(src.separable);
}